

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xpath.c
# Opt level: O3

void xmlXPathErr(xmlXPathParserContextPtr ctxt,int code)

{
  xmlXPathContextPtr pxVar1;
  xmlXPathContextPtr pxVar2;
  xmlChar *pxVar3;
  xmlGenericErrorFunc *pp_Var4;
  void **ppvVar5;
  int iVar6;
  xmlStructuredErrorFunc schannel;
  uint uVar7;
  xmlNodePtr node;
  xmlGenericErrorFunc channel;
  
  if (ctxt == (xmlXPathParserContextPtr)0x0) {
    return;
  }
  uVar7 = 0x1b;
  if ((uint)code < 0x1b) {
    uVar7 = code;
  }
  if (ctxt->error != 0) {
    return;
  }
  ctxt->error = uVar7;
  pxVar1 = ctxt->context;
  if (pxVar1 == (xmlXPathContextPtr)0x0) {
    node = (xmlNodePtr)0x0;
LAB_001b8c02:
    pp_Var4 = __xmlGenericError();
    channel = *pp_Var4;
    ppvVar5 = __xmlGenericErrorContext();
    pxVar3 = ctxt->base;
    iVar6 = *(int *)&ctxt->cur - (int)pxVar3;
    schannel = (xmlStructuredErrorFunc)0x0;
  }
  else {
    if ((pxVar1->lastError).code == 2) {
      return;
    }
    xmlResetError(&pxVar1->lastError);
    (pxVar1->lastError).domain = 0xc;
    (pxVar1->lastError).code = uVar7 + 0x4b0;
    (pxVar1->lastError).level = XML_ERR_ERROR;
    if (ctxt->base == (xmlChar *)0x0) {
      pxVar3 = (xmlChar *)0x0;
    }
    else {
      pxVar3 = xmlStrdup(ctxt->base);
      (pxVar1->lastError).str1 = (char *)pxVar3;
      if (pxVar3 == (xmlChar *)0x0) goto LAB_001b8cc3;
      pxVar3 = ctxt->base;
    }
    iVar6 = *(int *)&ctxt->cur - (int)pxVar3;
    (pxVar1->lastError).int1 = iVar6;
    pxVar2 = ctxt->context;
    node = pxVar2->debugNode;
    (pxVar1->lastError).node = node;
    schannel = pxVar2->error;
    if (schannel == (xmlStructuredErrorFunc)0x0) goto LAB_001b8c02;
    ppvVar5 = &pxVar2->userData;
    channel = (xmlGenericErrorFunc)0x0;
  }
  iVar6 = xmlRaiseError(schannel,channel,*ppvVar5,(void *)0x0,node,0xc,uVar7 + 0x4b0,XML_ERR_ERROR,
                        (char *)0x0,0,(char *)pxVar3,(char *)0x0,(char *)0x0,iVar6,0,"%s",
                        xmlXPathErrorMessages_rel +
                        *(int *)(xmlXPathErrorMessages_rel + (ulong)uVar7 * 4));
  if (-1 < iVar6) {
    return;
  }
LAB_001b8cc3:
  xmlXPathPErrMemory(ctxt);
  return;
}

Assistant:

void
xmlXPathErr(xmlXPathParserContextPtr ctxt, int code)
{
    xmlStructuredErrorFunc schannel = NULL;
    xmlGenericErrorFunc channel = NULL;
    void *data = NULL;
    xmlNodePtr node = NULL;
    int res;

    if (ctxt == NULL)
        return;
    if ((code < 0) || (code > MAXERRNO))
	code = MAXERRNO;
    /* Only report the first error */
    if (ctxt->error != 0)
        return;

    ctxt->error = code;

    if (ctxt->context != NULL) {
        xmlErrorPtr err = &ctxt->context->lastError;

        /* Don't overwrite memory error. */
        if (err->code == XML_ERR_NO_MEMORY)
            return;

        /* cleanup current last error */
        xmlResetError(err);

        err->domain = XML_FROM_XPATH;
        err->code = code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK;
        err->level = XML_ERR_ERROR;
        if (ctxt->base != NULL) {
            err->str1 = (char *) xmlStrdup(ctxt->base);
            if (err->str1 == NULL) {
                xmlXPathPErrMemory(ctxt);
                return;
            }
        }
        err->int1 = ctxt->cur - ctxt->base;
        err->node = ctxt->context->debugNode;

        schannel = ctxt->context->error;
        data = ctxt->context->userData;
        node = ctxt->context->debugNode;
    }

    if (schannel == NULL) {
        channel = xmlGenericError;
        data = xmlGenericErrorContext;
    }

    res = xmlRaiseError(schannel, channel, data, NULL, node, XML_FROM_XPATH,
                        code + XML_XPATH_EXPRESSION_OK - XPATH_EXPRESSION_OK,
                        XML_ERR_ERROR, NULL, 0,
                        (const char *) ctxt->base, NULL, NULL,
                        ctxt->cur - ctxt->base, 0,
                        "%s", xmlXPathErrorMessages[code]);
    if (res < 0)
        xmlXPathPErrMemory(ctxt);
}